

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

bool __thiscall
MakefileGenerator::verifyExtraCompiler
          (MakefileGenerator *this,ProString *comp,QString *file_unfixed)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  QString *pQVar5;
  const_iterator cVar6;
  ProString *pPVar7;
  char *pcVar8;
  ProStringList *pPVar9;
  MakefileGenerator *in_RDI;
  long in_FS_OFFSET;
  char cVar10;
  ProStringList *inputs_1;
  ProStringList *tmp_1;
  bool pass_1;
  ProStringList *inputs;
  ProStringList *tmp;
  bool pass;
  bool invert;
  int i;
  ProStringList *config;
  QString cmd_1;
  QString out;
  QString in_1;
  QString inpf_1;
  ConstIterator input_1;
  ConstIterator it_1;
  QString cmd;
  QString tmp_cmd;
  QString tmp_out_1;
  QString in;
  QString inpf;
  ConstIterator input;
  ConstIterator it;
  ProString verify;
  ProStringList verify_function;
  ProString tmp_out;
  QString file;
  undefined4 in_stack_fffffffffffff878;
  FileFixifyType in_stack_fffffffffffff87c;
  undefined7 in_stack_fffffffffffff880;
  undefined1 in_stack_fffffffffffff887;
  undefined4 in_stack_fffffffffffff88c;
  QChar sep;
  ProKey *in_stack_fffffffffffff890;
  QMakeEvaluator *in_stack_fffffffffffff898;
  QMakeSourceFileInfo *in_stack_fffffffffffff8a0;
  ReplaceFor forShell;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  ProKey *in_stack_fffffffffffff8b0;
  QMakeProject *in_00;
  QMakeProject *in_stack_fffffffffffff8b8;
  MakefileGenerator *in_stack_fffffffffffff8c0;
  QMakeProject *pQVar11;
  byte in_stack_fffffffffffff927;
  QString *in_stack_fffffffffffff928;
  MakefileGenerator *in_stack_fffffffffffff930;
  bool local_671;
  byte local_64a;
  int local_648;
  int local_644;
  byte local_619;
  const_iterator local_560;
  const_iterator local_558;
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_550;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  QChar local_4c2;
  QStringBuilder<const_ProString_&,_const_char_(&)[10]> local_4c0;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_468;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined1 local_308 [32];
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  const_iterator local_2b8;
  const_iterator local_2b0;
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_2a8;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_fffffffffffffddc;
  undefined1 local_208 [75];
  QLatin1Char local_1bd [3];
  char16_t local_1ba;
  undefined1 local_1b8 [48];
  QStringBuilder<const_ProString_&,_const_char_(&)[17]> local_188;
  QList<ProString> local_148;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_130;
  ProString local_f0 [3];
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_60;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = noIO(in_RDI);
  if (bVar1) {
    local_619 = 0;
    goto LAB_00180df5;
  }
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  Option::normalizePath
            ((QString *)in_stack_fffffffffffff898,SUB81((ulong)in_stack_fffffffffffff890 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffff890 >> 0x30,0));
  local_60 = ::operator+((ProString *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (char (*) [8])CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878)
                        );
  ProKey::ProKey<ProString_const&,char_const(&)[8]>
            ((ProKey *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
             (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)
             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  QMakeProject::values
            ((QMakeProject *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
             (ProKey *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  ProKey::~ProKey((ProKey *)0x17fb61);
  qVar4 = QListSpecialMethodsBase<ProString>::indexOf<char[11]>
                    ((QListSpecialMethodsBase<ProString> *)
                     CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                     (char (*) [11])CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                     0x17fb89);
  if (qVar4 == -1) {
    qVar4 = QListSpecialMethodsBase<ProString>::indexOf<char[16]>
                      ((QListSpecialMethodsBase<ProString> *)
                       CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                       (char (*) [16])CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                       0x17fca3);
    forShell = (ReplaceFor)((ulong)in_stack_fffffffffffff8a0 >> 0x20);
    sep.ucs = (char16_t)((uint)in_stack_fffffffffffff88c >> 0x10);
    if (qVar4 == -1) {
      qVar4 = QListSpecialMethodsBase<ProString>::indexOf<char[7]>
                        ((QListSpecialMethodsBase<ProString> *)
                         CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (char (*) [7])CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878)
                         ,0x180675);
      if (qVar4 != -1) {
        local_3f8 = 0xaaaaaaaaaaaaaaaa;
        local_3f0 = 0xaaaaaaaaaaaaaaaa;
        local_3e8 = 0xaaaaaaaaaaaaaaaa;
        pQVar11 = in_RDI->project;
        local_468 = ::operator+((ProString *)
                                CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                (char (*) [8])
                                CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        ProKey::ProKey<ProString_const&,char_const(&)[8]>
                  ((ProKey *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                   (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)
                   CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        QMakeEvaluator::first(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
        ProString::toQString
                  ((ProString *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        ProString::~ProString((ProString *)0x180735);
        ProKey::~ProKey((ProKey *)0x180742);
        bVar1 = QString::isEmpty((QString *)0x18074f);
        if (bVar1) {
          local_619 = 0;
          cVar10 = '\x01';
        }
        else {
          local_480 = 0xaaaaaaaaaaaaaaaa;
          local_478 = 0xaaaaaaaaaaaaaaaa;
          local_470 = 0xaaaaaaaaaaaaaaaa;
          in_00 = in_RDI->project;
          local_4c0 = ::operator+((ProString *)
                                  CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                  (char (*) [10])
                                  CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
          ProKey::ProKey<ProString_const&,char_const(&)[10]>
                    ((ProKey *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                     (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)
                     CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
          pQVar5 = (QString *)
                   QMakeProject::values
                             ((QMakeProject *)
                              CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                              (ProKey *)
                              CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
          QChar::QChar<char,_true>(&local_4c2,' ');
          ProStringList::join((ProStringList *)
                              CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),sep);
          ProKey::~ProKey((ProKey *)0x180837);
          qVar4 = QListSpecialMethodsBase<ProString>::indexOf<char[8]>
                            ((QListSpecialMethodsBase<ProString> *)
                             CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                             (char (*) [8])
                             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),0x18084f)
          ;
          if (qVar4 == -1) {
            local_550 = ::operator+((ProString *)
                                    CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                    (char (*) [7])
                                    CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
            ProKey::ProKey<ProString_const&,char_const(&)[7]>
                      ((ProKey *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                       (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)
                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
            pPVar9 = QMakeProject::values
                               ((QMakeProject *)
                                CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                (ProKey *)
                                CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
            ProKey::~ProKey((ProKey *)0x1809dd);
            local_558.i = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_558 = QList<ProString>::begin
                                  ((QList<ProString> *)
                                   CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
            while( true ) {
              cVar6 = QList<ProString>::end
                                ((QList<ProString> *)
                                 CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
              bVar1 = QList<ProString>::const_iterator::operator!=(&local_558,cVar6);
              if (!bVar1) break;
              QList<ProString>::const_iterator::operator*(&local_558);
              QMakeProject::values
                        ((QMakeProject *)
                         CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (ProKey *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
              local_560.i = (ProString *)0xaaaaaaaaaaaaaaaa;
              local_560 = QList<ProString>::begin
                                    ((QList<ProString> *)
                                     CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
              while( true ) {
                cVar6 = QList<ProString>::end
                                  ((QList<ProString> *)
                                   CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
                bVar1 = QList<ProString>::const_iterator::operator!=(&local_560,cVar6);
                if (!bVar1) break;
                pPVar7 = QList<ProString>::const_iterator::operator*(&local_560);
                bVar1 = ProString::isEmpty(pPVar7);
                if (!bVar1) {
                  QList<ProString>::const_iterator::operator*(&local_560);
                  ProString::toQString
                            ((ProString *)
                             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                  QFlags<MakefileGenerator::FileFixifyType>::QFlags
                            ((QFlags<MakefileGenerator::FileFixifyType> *)
                             CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                             in_stack_fffffffffffff87c);
                  fileFixify(in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                             (FileFixifyTypes)in_stack_fffffffffffffddc.i,
                             (bool)in_stack_fffffffffffff927);
                  bVar1 = ::operator==((QString *)
                                       CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880)
                                       ,(QString *)
                                        CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878
                                                ));
                  if (bVar1) {
                    QString::QString((QString *)0x180c15);
                    replaceExtraCompilerVariables
                              ((MakefileGenerator *)pQVar11,pQVar5,(QString *)in_00,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                               (ReplaceFor)((ulong)pPVar9 >> 0x20));
                    QString::~QString((QString *)0x180c52);
                    replaceExtraCompilerVariables
                              ((MakefileGenerator *)pQVar11,pQVar5,(QString *)in_00,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                               (ReplaceFor)((ulong)pPVar9 >> 0x20));
                    QString::toLatin1((QString *)
                                      CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878))
                    ;
                    pcVar8 = QByteArray::constData((QByteArray *)0x180cd4);
                    iVar3 = system(pcVar8);
                    QByteArray::~QByteArray((QByteArray *)0x180ced);
                    if (iVar3 == 0) {
                      cVar10 = '\x0e';
                    }
                    else {
                      local_619 = 0;
                      cVar10 = '\x01';
                    }
                    QString::~QString((QString *)0x180d23);
                    QString::~QString((QString *)0x180d30);
                  }
                  else {
                    cVar10 = '\0';
                  }
                  QString::~QString((QString *)0x180d4a);
                  QString::~QString((QString *)0x180d57);
                  if (cVar10 != '\0') {
                    if (cVar10 != '\x0e') goto LAB_00180da8;
                    break;
                  }
                }
                QList<ProString>::const_iterator::operator++(&local_560);
              }
              QList<ProString>::const_iterator::operator++(&local_558);
            }
LAB_00180d9d:
            cVar10 = '\0';
          }
          else {
            local_4e0 = 0xaaaaaaaaaaaaaaaa;
            local_4d8 = 0xaaaaaaaaaaaaaaaa;
            local_4d0 = 0xaaaaaaaaaaaaaaaa;
            QString::QString((QString *)0x180893);
            replaceExtraCompilerVariables
                      ((MakefileGenerator *)pQVar11,pQVar5,(QString *)in_00,
                       (QString *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                       forShell);
            QString::~QString((QString *)0x1808d3);
            QString::toLatin1((QString *)
                              CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
            pcVar8 = QByteArray::constData((QByteArray *)0x1808f5);
            iVar3 = system(pcVar8);
            QByteArray::~QByteArray((QByteArray *)0x18090e);
            cVar10 = iVar3 != 0;
            if ((bool)cVar10) {
              local_619 = 0;
            }
            QString::~QString((QString *)0x180944);
            if (!(bool)cVar10) goto LAB_00180d9d;
          }
LAB_00180da8:
          QString::~QString((QString *)0x180db5);
        }
        QString::~QString((QString *)0x180dc2);
        if (cVar10 != '\0') goto LAB_00180de8;
      }
    }
    else {
      memset(local_f0,0xaa,0x30);
      local_130 = ::operator+((ProString *)
                              CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                              (char (*) [8])
                              CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      ProKey::ProKey<ProString_const&,char_const(&)[8]>
                ((ProKey *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)
                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      QMakeEvaluator::first(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
      ProKey::~ProKey((ProKey *)0x17fd3e);
      bVar1 = ProString::isEmpty(local_f0);
      if (bVar1) {
        local_619 = 0;
        local_644 = 1;
      }
      else {
        local_148.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_148.d.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_148.d.size = -0x5555555555555556;
        pQVar11 = in_RDI->project;
        local_188 = ::operator+((ProString *)
                                CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                (char (*) [17])
                                CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        ProKey::ProKey<ProString_const&,char_const(&)[17]>
                  ((ProKey *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                   (QStringBuilder<const_ProString_&,_const_char_(&)[17]> *)
                   CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        QMakeProject::values
                  ((QMakeProject *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                   (ProKey *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        ProStringList::ProStringList
                  ((ProStringList *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                   (ProStringList *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        ProKey::~ProKey((ProKey *)0x17fe18);
        bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x17fe25);
        if (bVar1) {
          local_619 = 0;
          local_644 = 1;
        }
        else {
          local_648 = 0;
          while( true ) {
            pQVar5 = (QString *)(long)local_648;
            qVar4 = QList<ProString>::size(&local_148);
            if (qVar4 <= (long)pQVar5) break;
            memset(local_1b8,0xaa,0x30);
            QList<ProString>::at
                      ((QList<ProString> *)
                       CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
            ProString::ProString
                      ((ProString *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                       (ProString *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
            local_1ba = (char16_t)
                        ProString::at((ProString *)
                                      CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                      in_stack_fffffffffffff87c);
            QLatin1Char::QLatin1Char(local_1bd,'!');
            QChar::QChar<QLatin1Char,_true>
                      ((QChar *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                       (QLatin1Char)(char)((uint)in_stack_fffffffffffff88c >> 0x18));
            bVar1 = ::operator==((QChar *)CONCAT17(in_stack_fffffffffffff887,
                                                   in_stack_fffffffffffff880),
                                 (QChar *)CONCAT44(in_stack_fffffffffffff87c,
                                                   in_stack_fffffffffffff878));
            if (bVar1) {
              ProString::mid((ProString *)in_stack_fffffffffffff898,
                             (int)((ulong)in_stack_fffffffffffff890 >> 0x20),
                             (int)in_stack_fffffffffffff890);
              ProString::operator=
                        ((ProString *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (ProString *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878))
              ;
              ProString::~ProString((ProString *)0x17ff65);
            }
            qVar4 = QListSpecialMethodsBase<ProString>::indexOf<char[8]>
                              ((QListSpecialMethodsBase<ProString> *)
                               CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                               (char (*) [8])
                               CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                               0x17ff7d);
            if (qVar4 == -1) {
              local_2a8 = ::operator+((ProString *)
                                      CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                      (char (*) [7])
                                      CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878))
              ;
              ProKey::ProKey<ProString_const&,char_const(&)[7]>
                        ((ProKey *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)
                         CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
              QMakeProject::values
                        ((QMakeProject *)
                         CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (ProKey *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
              ProKey::~ProKey((ProKey *)0x180182);
              local_2b0.i = (ProString *)0xaaaaaaaaaaaaaaaa;
              local_2b0 = QList<ProString>::begin
                                    ((QList<ProString> *)
                                     CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
              while( true ) {
                cVar6 = QList<ProString>::end
                                  ((QList<ProString> *)
                                   CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
                bVar2 = QList<ProString>::const_iterator::operator!=(&local_2b0,cVar6);
                if (!bVar2) break;
                QList<ProString>::const_iterator::operator*(&local_2b0);
                QMakeProject::values
                          ((QMakeProject *)
                           CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                           (ProKey *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                local_2b8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
                local_2b8 = QList<ProString>::begin
                                      ((QList<ProString> *)
                                       CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880)
                                      );
                while( true ) {
                  cVar6 = QList<ProString>::end
                                    ((QList<ProString> *)
                                     CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
                  bVar2 = QList<ProString>::const_iterator::operator!=(&local_2b8,cVar6);
                  if (!bVar2) break;
                  pPVar7 = QList<ProString>::const_iterator::operator*(&local_2b8);
                  bVar2 = ProString::isEmpty(pPVar7);
                  if (!bVar2) {
                    local_2d0 = 0xaaaaaaaaaaaaaaaa;
                    local_2c8 = 0xaaaaaaaaaaaaaaaa;
                    local_2c0 = 0xaaaaaaaaaaaaaaaa;
                    QList<ProString>::const_iterator::operator*(&local_2b8);
                    ProString::toQString
                              ((ProString *)
                               CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                    local_2e8 = 0xaaaaaaaaaaaaaaaa;
                    local_2e0 = 0xaaaaaaaaaaaaaaaa;
                    local_2d8 = 0xaaaaaaaaaaaaaaaa;
                    QFlags<MakefileGenerator::FileFixifyType>::QFlags
                              ((QFlags<MakefileGenerator::FileFixifyType> *)
                               CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                               in_stack_fffffffffffff87c);
                    fileFixify((MakefileGenerator *)pQVar11,pQVar5,
                               (FileFixifyTypes)in_stack_fffffffffffffddc.i,
                               (bool)in_stack_fffffffffffff927);
                    bVar2 = ::operator==((QString *)
                                         CONCAT17(in_stack_fffffffffffff887,
                                                  in_stack_fffffffffffff880),
                                         (QString *)
                                         CONCAT44(in_stack_fffffffffffff87c,
                                                  in_stack_fffffffffffff878));
                    if (bVar2) {
                      memset(local_308,0,0x18);
                      QList<ProStringList>::QList((QList<ProStringList> *)0x1803d5);
                      ProString::toQString
                                ((ProString *)
                                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                      QString::QString((QString *)0x1803f7);
                      replaceExtraCompilerVariables
                                (in_stack_fffffffffffff8c0,(QString *)in_stack_fffffffffffff8b8,
                                 (QString *)in_stack_fffffffffffff8b0,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                                 (ReplaceFor)((ulong)in_stack_fffffffffffff8a0 >> 0x20));
                      ProString::ProString
                                ((ProString *)
                                 CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                      ProStringList::ProStringList
                                ((ProStringList *)
                                 CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                 (ProString *)
                                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                      QList<ProStringList>::operator<<
                                ((QList<ProStringList> *)
                                 CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                 (rvalue_ref)
                                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                      ProString::ProString
                                ((ProString *)
                                 CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                      ProStringList::ProStringList
                                ((ProStringList *)
                                 CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                 (ProString *)
                                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                      QList<ProStringList>::operator<<
                                ((QList<ProStringList> *)
                                 CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                                 (rvalue_ref)
                                 CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                      local_671 = QMakeProject::test(in_stack_fffffffffffff8b8,
                                                     in_stack_fffffffffffff8b0,
                                                     (QList<ProStringList> *)
                                                     CONCAT44(in_stack_fffffffffffff8ac,
                                                              in_stack_fffffffffffff8a8));
                      ProStringList::~ProStringList((ProStringList *)0x1804ca);
                      ProString::~ProString((ProString *)0x1804d7);
                      ProStringList::~ProStringList((ProStringList *)0x1804e4);
                      ProString::~ProString((ProString *)0x1804f1);
                      QString::~QString((QString *)0x1804fe);
                      QString::~QString((QString *)0x18050b);
                      QString::~QString((QString *)0x180518);
                      QList<ProStringList>::~QList((QList<ProStringList> *)0x180525);
                      if (bVar1) {
                        local_671 = (bool)((local_671 ^ 0xffU) & 1);
                      }
                      if (local_671 == false) {
                        local_619 = 0;
                        local_644 = 1;
                      }
                      else {
                        local_644 = 8;
                      }
                    }
                    else {
                      local_644 = 0;
                    }
                    QString::~QString((QString *)0x180592);
                    QString::~QString((QString *)0x18059f);
                    if (local_644 != 0) {
                      if (local_644 != 8) goto LAB_001805f0;
                      break;
                    }
                  }
                  QList<ProString>::const_iterator::operator++(&local_2b8);
                }
                QList<ProString>::const_iterator::operator++(&local_2b0);
              }
LAB_001805e5:
              local_644 = 0;
            }
            else {
              memset(local_208,0,0x18);
              QList<ProStringList>::QList((QList<ProStringList> *)0x17ffdf);
              ProStringList::ProStringList
                        ((ProStringList *)
                         CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (ProString *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878))
              ;
              QList<ProStringList>::operator<<
                        ((QList<ProStringList> *)
                         CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (rvalue_ref)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
              ProString::ProString
                        ((ProString *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (QString *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
              ProStringList::ProStringList
                        ((ProStringList *)
                         CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (ProString *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878))
              ;
              QList<ProStringList>::operator<<
                        ((QList<ProStringList> *)
                         CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                         (rvalue_ref)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
              in_stack_fffffffffffff927 =
                   QMakeProject::test(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                                      (QList<ProStringList> *)
                                      CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8))
              ;
              ProStringList::~ProStringList((ProStringList *)0x18007c);
              ProString::~ProString((ProString *)0x180089);
              ProStringList::~ProStringList((ProStringList *)0x180096);
              QList<ProStringList>::~QList((QList<ProStringList> *)0x1800a3);
              local_64a = in_stack_fffffffffffff927 & 1;
              if (bVar1) {
                local_64a = (local_64a ^ 0xff) & 1;
              }
              if (local_64a != 0) goto LAB_001805e5;
              local_619 = 0;
              local_644 = 1;
            }
LAB_001805f0:
            ProString::~ProString((ProString *)0x1805fd);
            if (local_644 != 0) goto LAB_0018062d;
            local_648 = local_648 + 1;
          }
          local_644 = 0;
        }
LAB_0018062d:
        ProStringList::~ProStringList((ProStringList *)0x18063a);
      }
      ProString::~ProString((ProString *)0x180647);
      if (local_644 != 0) goto LAB_00180de8;
    }
LAB_00180dd5:
    local_619 = 1;
  }
  else {
    bVar1 = QString::isNull((QString *)0x17fba0);
    if (bVar1) goto LAB_00180dd5;
    QMakeSourceFileInfo::addSourceFile
              (in_stack_fffffffffffff8a0,(QString *)in_stack_fffffffffffff898,
               (uchar)((ulong)in_stack_fffffffffffff890 >> 0x38),
               (SourceFileType)in_stack_fffffffffffff890);
    bVar1 = QMakeSourceFileInfo::mocable
                      (in_stack_fffffffffffff8a0,(QString *)in_stack_fffffffffffff898);
    if (bVar1) {
      ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                     (char *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      QMakeProject::values
                ((QMakeProject *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                 (ProKey *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      ProString::ProString
                ((ProString *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                 (QString *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      QList<ProString>::append
                ((QList<ProString> *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      ProString::~ProString((ProString *)0x17fc77);
      ProKey::~ProKey((ProKey *)0x17fc84);
      goto LAB_00180dd5;
    }
    local_619 = 0;
  }
LAB_00180de8:
  QString::~QString((QString *)0x180df5);
LAB_00180df5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_619 & 1);
}

Assistant:

bool
MakefileGenerator::verifyExtraCompiler(const ProString &comp, const QString &file_unfixed)
{
    if(noIO())
        return false;
    const QString file = Option::normalizePath(file_unfixed);

    const ProStringList &config = project->values(ProKey(comp + ".CONFIG"));
    if (config.indexOf("moc_verify") != -1) {
        if(!file.isNull()) {
            QMakeSourceFileInfo::addSourceFile(file, QMakeSourceFileInfo::SEEK_MOCS);
            if(!mocable(file)) {
                return false;
            } else {
                project->values("MOCABLES").append(file);
            }
        }
    } else if (config.indexOf("function_verify") != -1) {
        ProString tmp_out = project->first(ProKey(comp + ".output"));
        if(tmp_out.isEmpty())
            return false;
        ProStringList verify_function = project->values(ProKey(comp + ".verify_function"));
        if(verify_function.isEmpty())
            return false;

        for(int i = 0; i < verify_function.size(); ++i) {
            bool invert = false;
            ProString verify = verify_function.at(i);
            if(verify.at(0) == QLatin1Char('!')) {
                invert = true;
                verify = verify.mid(1);
            }

            if (config.indexOf("combine") != -1) {
                bool pass = project->test(verify.toKey(), QList<ProStringList>() << ProStringList(tmp_out) << ProStringList(file));
                if(invert)
                    pass = !pass;
                if(!pass)
                    return false;
            } else {
                const ProStringList &tmp = project->values(ProKey(comp + ".input"));
                for (ProStringList::ConstIterator it = tmp.begin(); it != tmp.end(); ++it) {
                    const ProStringList &inputs = project->values((*it).toKey());
                    for (ProStringList::ConstIterator input = inputs.begin(); input != inputs.end(); ++input) {
                        if((*input).isEmpty())
                            continue;
                        QString inpf = (*input).toQString();
                        QString in = fileFixify(inpf);
                        if(in == file) {
                            bool pass = project->test(verify.toKey(),
                                                      QList<ProStringList>() << ProStringList(replaceExtraCompilerVariables(tmp_out.toQString(), inpf, QString(), NoShell)) <<
                                                      ProStringList(file));
                            if(invert)
                                pass = !pass;
                            if(!pass)
                                return false;
                            break;
                        }
                    }
                }
            }
        }
    } else if (config.indexOf("verify") != -1) {
        QString tmp_out = project->first(ProKey(comp + ".output")).toQString();
        if(tmp_out.isEmpty())
            return false;
        const QString tmp_cmd = project->values(ProKey(comp + ".commands")).join(' ');
        if (config.indexOf("combine") != -1) {
            QString cmd = replaceExtraCompilerVariables(tmp_cmd, QString(), tmp_out, LocalShell);
            if(system(cmd.toLatin1().constData()))
                return false;
        } else {
            const ProStringList &tmp = project->values(ProKey(comp + ".input"));
            for (ProStringList::ConstIterator it = tmp.begin(); it != tmp.end(); ++it) {
                const ProStringList &inputs = project->values((*it).toKey());
                for (ProStringList::ConstIterator input = inputs.begin(); input != inputs.end(); ++input) {
                    if((*input).isEmpty())
                        continue;
                    QString inpf = (*input).toQString();
                    QString in = fileFixify(inpf);
                    if(in == file) {
                        QString out = replaceExtraCompilerVariables(tmp_out, inpf, QString(), NoShell);
                        QString cmd = replaceExtraCompilerVariables(tmp_cmd, in, out, LocalShell);
                        if(system(cmd.toLatin1().constData()))
                            return false;
                        break;
                    }
                }
            }
        }
    }
    return true;
}